

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextWindowPos(ImVec2 *pos,ImGuiCond cond,ImVec2 *pivot)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiCond local_30;
  bool local_29;
  ImGuiContext_conflict *g;
  ImVec2 *pivot_local;
  ImGuiCond cond_local;
  ImVec2 *pos_local;
  
  pIVar1 = GImGui;
  local_29 = true;
  if (cond != 0) {
    local_29 = ImIsPowerOfTwo(cond);
  }
  if (local_29 != false) {
    (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 1;
    (pIVar1->NextWindowData).PosVal = *pos;
    (pIVar1->NextWindowData).PosPivotVal = *pivot;
    local_30 = cond;
    if (cond == 0) {
      local_30 = 1;
    }
    (pIVar1->NextWindowData).PosCond = local_30;
    (pIVar1->NextWindowData).PosUndock = true;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1d69,"void ImGui::SetNextWindowPos(const ImVec2 &, ImGuiCond, const ImVec2 &)");
}

Assistant:

void ImGui::SetNextWindowPos(const ImVec2& pos, ImGuiCond cond, const ImVec2& pivot)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasPos;
    g.NextWindowData.PosVal = pos;
    g.NextWindowData.PosPivotVal = pivot;
    g.NextWindowData.PosCond = cond ? cond : ImGuiCond_Always;
    g.NextWindowData.PosUndock = true;
}